

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O1

void __thiscall
Lib::Exception::Exception<char_const*,std::__cxx11::string,char_const*>
          (Exception *this,char *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg_1,char *msg_2)

{
  pointer pcVar1;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar1 = (msg_1->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + msg_1->_M_string_length);
  toString<char_const*,std::__cxx11::string,char_const*>(&local_68,this,msg,&local_48,msg_2);
  this->_vptr_Exception = (_func_int **)&PTR_cry_00b69f40;
  (this->_message)._M_dataplus._M_p = (pointer)&(this->_message).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_message,local_68._M_dataplus._M_p,
             local_68._M_dataplus._M_p + local_68._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

explicit Exception(Msg... msg)
   : Exception(toString(msg...))
  { }